

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_time.cc
# Opt level: O3

ASN1_GENERALIZEDTIME * ASN1_TIME_to_generalizedtime(ASN1_TIME *t,ASN1_GENERALIZEDTIME **out)

{
  uchar *dst;
  int iVar1;
  ASN1_STRING *str;
  char *src;
  size_t dst_size;
  
  iVar1 = ASN1_TIME_check(t);
  if (iVar1 != 0) {
    if (((out == (ASN1_GENERALIZEDTIME **)0x0) || (str = *out, str == (ASN1_STRING *)0x0)) &&
       (str = ASN1_GENERALIZEDTIME_new(), str == (ASN1_GENERALIZEDTIME *)0x0)) {
      str = (ASN1_GENERALIZEDTIME *)0x0;
    }
    else if (t->type == 0x18) {
      iVar1 = ASN1_STRING_set(str,t->data,t->length);
      if (iVar1 != 0) {
LAB_00442c6b:
        if (out == (ASN1_GENERALIZEDTIME **)0x0) {
          return str;
        }
        if (*out != (ASN1_GENERALIZEDTIME *)0x0) {
          return str;
        }
        *out = str;
        return str;
      }
    }
    else {
      iVar1 = ASN1_STRING_set(str,(void *)0x0,t->length + 2);
      if (iVar1 != 0) {
        dst = str->data;
        dst_size = (long)t->length + 3;
        src = "20";
        if (0x34 < *t->data) {
          src = "19";
        }
        OPENSSL_strlcpy((char *)dst,src,dst_size);
        OPENSSL_strlcat((char *)dst,(char *)t->data,dst_size);
        goto LAB_00442c6b;
      }
    }
    if ((out == (ASN1_GENERALIZEDTIME **)0x0) || (*out != str)) {
      ASN1_GENERALIZEDTIME_free(str);
    }
  }
  return (ASN1_GENERALIZEDTIME *)0x0;
}

Assistant:

ASN1_GENERALIZEDTIME *ASN1_TIME_to_generalizedtime(const ASN1_TIME *in,
                                                   ASN1_GENERALIZEDTIME **out) {
  if (!ASN1_TIME_check(in)) {
    return NULL;
  }

  ASN1_GENERALIZEDTIME *ret = NULL;
  if (!out || !*out) {
    if (!(ret = ASN1_GENERALIZEDTIME_new())) {
      goto err;
    }
  } else {
    ret = *out;
  }

  // If already GeneralizedTime just copy across
  if (in->type == V_ASN1_GENERALIZEDTIME) {
    if (!ASN1_STRING_set(ret, in->data, in->length)) {
      goto err;
    }
    goto done;
  }

  // Grow the string to accomodate the two-digit century.
  if (!ASN1_STRING_set(ret, NULL, in->length + 2)) {
    goto err;
  }

  {
    char *const out_str = (char *)ret->data;
    // |ASN1_STRING_set| also allocates an additional byte for a trailing NUL.
    const size_t out_str_capacity = in->length + 2 + 1;
    // Work out the century and prepend
    if (in->data[0] >= '5') {
      OPENSSL_strlcpy(out_str, "19", out_str_capacity);
    } else {
      OPENSSL_strlcpy(out_str, "20", out_str_capacity);
    }
    OPENSSL_strlcat(out_str, (const char *)in->data, out_str_capacity);
  }

done:
  if (out != NULL && *out == NULL) {
    *out = ret;
  }
  return ret;

err:
  if (out == NULL || *out != ret) {
    ASN1_GENERALIZEDTIME_free(ret);
  }
  return NULL;
}